

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::moveRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  byte bVar6;
  int iVar7;
  QWidgetPrivate *this_00;
  QWidget *rect_00;
  QWidgetPrivate *this_01;
  pointer pQVar8;
  QWidgetRepaintManager *widget;
  ulong uVar9;
  int in_ECX;
  int in_EDX;
  QRect *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool childUpdatesEnabled;
  QWidgetRepaintManager *repaintManager;
  bool accelerateMove;
  bool nativeWithTextureChild;
  QWidgetPrivate *parentPrivate;
  QWidget *parentWidget;
  QWidget *tlw;
  QWidget *q;
  QRegion needsFlush;
  QRegion parentExpose;
  QRegion childExpose;
  QRegion parentRegion;
  QRect parentRect;
  QRect sourceRect;
  QRect destRect;
  QRect newRect;
  QRect clipR;
  QPoint toplevelOffset;
  QRect *in_stack_fffffffffffffe38;
  uint6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  byte bVar10;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar11;
  QWidget *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe60;
  uint uVar12;
  int in_stack_fffffffffffffe64;
  BufferState in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar13;
  QWidget *r;
  QWidgetPrivate *this_02;
  QRegion local_150;
  QPoint local_148;
  QRegion local_140;
  QRegion local_138;
  QRegion local_130;
  QRegion local_128;
  QRegion local_120;
  QPoint local_118;
  QPoint local_110;
  QRegion local_108;
  undefined1 local_100 [16];
  QRegion local_f0;
  QPoint local_e8;
  QPoint local_e0;
  undefined1 local_d8 [16];
  QRect local_c8;
  undefined1 local_b8 [16];
  QRegion local_a8;
  QRect local_a0;
  QRegion local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  QRect local_68;
  QRect local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar5 = QWidget::isVisible((QWidget *)0x3a529c);
  auVar4._8_8_ = local_88._8_8_;
  auVar4._0_8_ = local_88._0_8_;
  auVar3._8_8_ = local_100._8_8_;
  auVar3._0_8_ = local_100._0_8_;
  auVar2._8_8_ = local_b8._8_8_;
  auVar2._0_8_ = local_b8._0_8_;
  auVar1._8_8_ = local_d8._8_8_;
  auVar1._0_8_ = local_d8._0_8_;
  if ((!bVar5) ||
     ((in_EDX == 0 &&
      (local_d8 = auVar1, local_b8 = auVar2, local_100 = auVar3, local_88 = auVar4, in_ECX == 0))))
  goto LAB_003a5b9d;
  this_00 = (QWidgetPrivate *)QWidget::window(in_stack_fffffffffffffe50);
  if ((moveRect(QRect_const&,int,int)::accelEnv == '\0') &&
     (iVar7 = __cxa_guard_acquire(&moveRect(QRect_const&,int,int)::accelEnv), iVar7 != 0)) {
    iVar7 = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE",(bool *)0x0);
    moveRect::accelEnv = iVar7 == 0;
    __cxa_guard_release(&moveRect(QRect_const&,int,int)::accelEnv);
  }
  rect_00 = QWidget::parentWidget((QWidget *)0x3a5312);
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  r = rect_00;
  this_02 = this_00;
  QPoint::QPoint((QPoint *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
  local_10 = QWidget::mapTo((QWidget *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                            ,(QWidget *)in_RDI,(QPoint *)this_00);
  this_01 = QWidget::d_func((QWidget *)0x3a5370);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_16_ = (undefined1  [16])clipRect(this_01);
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (undefined1  [16])
             QRect::translated((QRect *)this_01,
                               CONCAT13(in_stack_fffffffffffffe77,
                                        CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74
                                                )),in_stack_fffffffffffffe70);
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (undefined1  [16])
             QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffe47,
                                                  CONCAT16(in_stack_fffffffffffffe46,
                                                           in_stack_fffffffffffffe40)),
                                in_stack_fffffffffffffe38);
  bVar5 = QRect::isValid((QRect *)CONCAT17(in_stack_fffffffffffffe47,
                                           CONCAT16(in_stack_fffffffffffffe46,
                                                    in_stack_fffffffffffffe40)));
  if (bVar5) {
    local_68 = QRect::translated((QRect *)this_01,
                                 CONCAT13(in_stack_fffffffffffffe77,
                                          CONCAT12(in_stack_fffffffffffffe76,
                                                   in_stack_fffffffffffffe74)),
                                 in_stack_fffffffffffffe70);
    local_58 = QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffe47,
                                                    CONCAT16(in_stack_fffffffffffffe46,
                                                             in_stack_fffffffffffffe40)),
                                  in_stack_fffffffffffffe38);
    local_48 = (undefined1  [16])local_58;
  }
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (undefined1  [16])
             QRect::translated((QRect *)this_01,
                               CONCAT13(in_stack_fffffffffffffe77,
                                        CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74
                                                )),in_stack_fffffffffffffe70);
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = QRect::operator&(in_RSI,(QRect *)local_28);
  uVar11 = false;
  if ((*(uint *)&in_RDI->field_0x250 >> 0x19 & 1) != 0) {
    uVar11 = hasPlatformWindow((QWidget *)
                               (ulong)CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40))
    ;
  }
  bVar10 = 0;
  uVar13 = uVar11;
  if ((((moveRect::accelEnv & 1U) != 0) &&
      (bVar10 = 0, (*(uint *)&in_RDI->field_0x250 >> 0x11 & 1) != 0)) &&
     (bVar10 = 0, (bool)uVar11 == false)) {
    bVar5 = QRect::isValid((QRect *)(ulong)in_stack_fffffffffffffe40);
    bVar10 = 0;
    if (bVar5) {
      QWidget::d_func((QWidget *)0x3a55ce);
      pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a55da);
      bVar10 = 0;
      if (pQVar8->proxyWidget == (QGraphicsProxyWidget *)0x0) {
        bVar5 = isOverlapped(this_00,(QRect *)rect_00);
        bVar10 = 0;
        if (!bVar5) {
          bVar5 = isOverlapped(this_00,(QRect *)rect_00);
          bVar10 = bVar5 ^ 0xff;
        }
      }
    }
  }
  bVar6 = bVar10 & 1;
  if (bVar6 != 0) {
    get((QWidget *)0x3a57e5);
    widget = maybeRepaintManager(this_00);
    local_f0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_100 = QRect::operator&((QRect *)local_38,(QRect *)local_28);
    QRegion::QRegion(&local_f0,(QRect *)local_100,Rectangle);
    bVar5 = QWidgetRepaintManager::bltRect
                      ((QWidgetRepaintManager *)
                       CONCAT17(uVar13,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffe74,
                                                               in_stack_fffffffffffffe70))),
                       (QRect *)widget,in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,
                       (QWidget *)in_RDI);
    if (bVar5) {
      QRegion::QRegion(&local_108,(QRect *)local_48,Rectangle);
      QRegion::operator-=(&local_f0,(QRegion *)&local_108);
      QRegion::~QRegion(&local_108);
    }
    bVar5 = QWidget::updatesEnabled((QWidget *)0x3a58a5);
    if (bVar5) {
      bVar5 = QWidget::updatesEnabled((QWidget *)0x3a58c0);
      uVar12 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffe60);
      if (bVar5) {
        uVar9 = QRegion::isEmpty();
        if ((uVar9 & 1) == 0) {
          local_118 = QRect::topLeft(in_stack_fffffffffffffe38);
          local_110 = ::operator-((QPoint *)
                                  CONCAT17(uVar11,CONCAT16(bVar10,in_stack_fffffffffffffe40)));
          QRegion::translate((QRegion *)this_00,(QPoint *)rect_00);
          QWidgetRepaintManager::markDirty<QRegion>
                    ((QWidgetRepaintManager *)this_02,(QRegion *)r,(QWidget *)this_01,
                     CONCAT13(uVar13,CONCAT12(bVar6,in_stack_fffffffffffffe74)),
                     in_stack_fffffffffffffe70);
          *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xffdfffff | 0x200000;
        }
      }
      local_120.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_120,(QRect *)local_88,Rectangle);
      QRegion::QRegion(&local_128,(QRect *)local_38,Rectangle);
      QRegion::operator-=(&local_120,(QRegion *)&local_128);
      QRegion::~QRegion(&local_128);
      bVar5 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a59d6);
      if (bVar5) {
        pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a59ed);
        if ((*(ushort *)&pQVar8->field_0x7c >> 7 & 1) != 0) {
          QRegion::QRegion(&local_138,(QRect *)local_38,Rectangle);
          pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a5a2a);
          local_148 = QRect::topLeft((QRect *)&pQVar8->mask);
          QRegion::translated((QRegion *)in_RDI,(QPoint *)this_00);
          QRegion::operator-(&local_130,(QRegion *)&local_138);
          QRegion::operator+=(&local_120,(QRegion *)&local_130);
          QRegion::~QRegion(&local_130);
          QRegion::~QRegion(&local_140);
          QRegion::~QRegion(&local_138);
        }
      }
      uVar9 = QRegion::isEmpty();
      if ((uVar9 & 1) == 0) {
        QWidgetRepaintManager::markDirty<QRegion>
                  ((QWidgetRepaintManager *)this_02,(QRegion *)r,(QWidget *)this_01,
                   CONCAT13(uVar13,CONCAT12(bVar6,in_stack_fffffffffffffe74)),
                   in_stack_fffffffffffffe70);
        *(uint *)&this_01->field_0x250 = *(uint *)&this_01->field_0x250 & 0xffdfffff | 0x200000;
      }
      if ((uVar12 & 0x1000000) != 0) {
        local_150.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_150,(QRect *)local_78,Rectangle);
        QRegion::operator+=(&local_150,(QRect *)local_48);
        QWidgetRepaintManager::markNeedsFlush
                  ((QWidgetRepaintManager *)
                   CONCAT17(uVar13,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffe74,
                                                           in_stack_fffffffffffffe70))),
                   (QWidget *)widget,(QRegion *)CONCAT44(in_stack_fffffffffffffe64,uVar12),
                   (QPoint *)in_RDI);
        QRegion::~QRegion(&local_150);
      }
      QRegion::~QRegion(&local_120);
    }
    QRegion::~QRegion(&local_f0);
    goto LAB_003a5b9d;
  }
  local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0 = effectiveRectFor(in_RDI,(QRect *)this_00);
  QRegion::QRegion(&local_90,(QRect *)&local_a0,Rectangle);
  bVar5 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a568c);
  if (bVar5) {
    pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3a56a0);
    if ((*(ushort *)&pQVar8->field_0x7c >> 7 & 1) == 0) goto LAB_003a56b4;
    local_b8 = QRect::operator&((QRect *)local_38,(QRect *)local_28);
    QRegion::operator+=(&local_90,(QRect *)local_b8);
  }
  else {
LAB_003a56b4:
    QRegion::QRegion(&local_a8,(QRect *)local_38,Rectangle);
    QRegion::operator-=(&local_90,(QRegion *)&local_a8);
    QRegion::~QRegion(&local_a8);
  }
  invalidateBackingStore<QRegion>(in_RDI,(QRegion *)this_00);
  local_d8 = QRect::operator&((QRect *)local_38,(QRect *)local_28);
  local_e8 = QRect::topLeft(in_stack_fffffffffffffe38);
  local_e0 = ::operator-((QPoint *)CONCAT17(uVar11,CONCAT16(bVar10,in_stack_fffffffffffffe40)));
  local_c8 = QRect::translated((QRect *)this_01,
                               (QPoint *)
                               CONCAT17(uVar13,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffe74,
                                                                       in_stack_fffffffffffffe70))))
  ;
  invalidateBackingStore<QRect>
            ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (QRect *)in_RDI);
  QRegion::~QRegion(&local_90);
LAB_003a5b9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::moveRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    if (!q->isVisible() || (dx == 0 && dy == 0))
        return;

    QWidget *tlw = q->window();

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE") == 0;

    QWidget *parentWidget = q->parentWidget();
    QPoint toplevelOffset = parentWidget->mapTo(tlw, QPoint());
    QWidgetPrivate *parentPrivate = parentWidget->d_func();
    const QRect clipR(parentPrivate->clipRect());
    const QRect newRect(rect.translated(dx, dy));
    QRect destRect = rect.intersected(clipR);
    if (destRect.isValid())
        destRect = destRect.translated(dx, dy).intersected(clipR);
    const QRect sourceRect(destRect.translated(-dx, -dy));
    const QRect parentRect(rect & clipR);
    const bool nativeWithTextureChild = textureChildSeen && hasPlatformWindow(q);

    bool accelerateMove = accelEnv && isOpaque && !nativeWithTextureChild && sourceRect.isValid()
#if QT_CONFIG(graphicsview)
                          // No accelerate move for proxy widgets.
                          && !tlw->d_func()->extra->proxyWidget
#endif
                          && !isOverlapped(sourceRect) && !isOverlapped(destRect);

    if (!accelerateMove) {
        QRegion parentRegion(effectiveRectFor(parentRect));
        if (!extra || !extra->hasMask) {
            parentRegion -= newRect;
        } else {
            // invalidateBackingStore() excludes anything outside the mask
            parentRegion += newRect & clipR;
        }
        parentPrivate->invalidateBackingStore(parentRegion);
        invalidateBackingStore((newRect & clipR).translated(-data.crect.topLeft()));
    } else {
        QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
        Q_ASSERT(repaintManager);
        QRegion childExpose(newRect & clipR);

        if (repaintManager->bltRect(sourceRect, dx, dy, parentWidget))
            childExpose -= destRect;

        if (!parentWidget->updatesEnabled())
            return;

        const bool childUpdatesEnabled = q->updatesEnabled();

        if (childUpdatesEnabled && !childExpose.isEmpty()) {
            childExpose.translate(-data.crect.topLeft());
            repaintManager->markDirty(childExpose, q);
            isMoved = true;
        }

        QRegion parentExpose(parentRect);
        parentExpose -= newRect;
        if (extra && extra->hasMask)
            parentExpose += QRegion(newRect) - extra->mask.translated(data.crect.topLeft());

        if (!parentExpose.isEmpty()) {
            repaintManager->markDirty(parentExpose, parentWidget);
            parentPrivate->isMoved = true;
        }

        if (childUpdatesEnabled) {
            QRegion needsFlush(sourceRect);
            needsFlush += destRect;
            repaintManager->markNeedsFlush(parentWidget, needsFlush, toplevelOffset);
        }
    }
}